

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

void decApplyRound(decNumber *dn,decContext *set,int32_t residue,uint32_t *status)

{
  byte bVar2;
  int iVar1;
  uint alength;
  int32_t m;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  if (residue == 0) {
    return;
  }
  switch(set->round) {
  case DEC_ROUND_CEILING:
    if ((char)dn->bits < '\0') goto switchD_00248a02_caseD_5;
  case DEC_ROUND_UP:
switchD_00248a02_caseD_1:
    if (residue < 1) {
      return;
    }
    break;
  case DEC_ROUND_HALF_UP:
    if (residue < 5) {
      return;
    }
    break;
  case DEC_ROUND_HALF_EVEN:
    if (residue < 6) {
      if (residue != 5) {
        return;
      }
      if ((dn->lsu[0] & 1) == 0) {
        return;
      }
    }
    break;
  case DEC_ROUND_HALF_DOWN:
    if (residue < 6) {
      return;
    }
    break;
  case DEC_ROUND_DOWN:
switchD_00248a02_caseD_5:
    if (-1 < residue) {
      return;
    }
LAB_00248ae1:
    alength = dn->digits;
    lVar4 = 9;
    m = -1;
    uVar5 = alength;
    while( true ) {
      bVar2 = dn->lsu[lVar4 + -9];
      if (uVar5 < 2) break;
      if (bVar2 != 0) goto LAB_00248b68;
      uVar5 = uVar5 - 1;
      lVar4 = lVar4 + 1;
    }
    lVar3 = 0xffffffff;
    if (alength != 0) {
      lVar3 = 0;
    }
    if (DECPOWERS[lVar3] == (uint)bVar2) {
      dn->lsu[lVar4 + -9] = (char)DECPOWERS[alength != 0] + 0xff;
      for (lVar3 = lVar4; 9 < lVar3; lVar3 = lVar3 + -1) {
        dn->lsu[lVar3 + -10] = '\t';
      }
      iVar1 = dn->exponent;
      dn->exponent = iVar1 + -1;
      if (iVar1 != (set->emin - set->digits) + 1) {
        return;
      }
      if ((alength == 0) || (dn->digits != 1)) {
        dn->lsu[lVar4 + -9] = bVar2 - 1;
        dn->digits = dn->digits + -1;
      }
      else {
        dn->lsu[lVar4 + -9] = '\0';
      }
      dn->exponent = dn->exponent + 1;
      *status = *status | 0x3820;
      return;
    }
    goto LAB_00248b68;
  case DEC_ROUND_FLOOR:
    if (-1 < (char)dn->bits) goto switchD_00248a02_caseD_5;
    goto switchD_00248a02_caseD_1;
  case DEC_ROUND_05UP:
    bVar2 = dn->lsu[0] % 5;
    if (residue < 0 && bVar2 != 1) goto LAB_00248ae1;
    if (residue < 1 || bVar2 != 0) {
      return;
    }
    break;
  default:
    *(byte *)status = (byte)*status | 0x40;
    return;
  }
  m = 1;
  lVar4 = 9;
  alength = dn->digits;
  for (uVar5 = alength; 1 < uVar5; uVar5 = uVar5 - 1) {
    if (dn->lsu[lVar4 + -9] != 9) goto LAB_00248b68;
    lVar4 = lVar4 + 1;
  }
  if (DECPOWERS[alength != 0] - 1 == (uint)dn->lsu[lVar4 + -9]) {
    lVar3 = 0xffffffff;
    if (alength != 0) {
      lVar3 = 0;
    }
    dn->lsu[lVar4 + -9] = (uint8_t)DECPOWERS[lVar3];
    for (; 9 < lVar4; lVar4 = lVar4 + -1) {
      dn->lsu[lVar4 + -10] = '\0';
    }
    iVar1 = dn->exponent + 1;
    dn->exponent = iVar1;
    if (iVar1 + dn->digits <= set->emax + 1) {
      return;
    }
    decSetOverflow(dn,set,status);
    return;
  }
LAB_00248b68:
  if ((int)alength < 0x32) {
    alength = (uint)""[(int)alength];
  }
  decUnitAddSub(dn->lsu,alength,"\x01",1,0,dn->lsu,m);
  return;
}

Assistant:

static void decApplyRound(decNumber *dn, decContext *set, Int residue,
                          uInt *status) {
  Int  bump;                  /* 1 if coefficient needs to be incremented  */
                              /* -1 if coefficient needs to be decremented  */

  if (residue==0) return;     /* nothing to apply  */

  bump=0;                     /* assume a smooth ride  */

  /* now decide whether, and how, to round, depending on mode  */
  switch (set->round) {
    case DEC_ROUND_05UP: {    /* round zero or five up (for reround)  */
      /* This is the same as DEC_ROUND_DOWN unless there is a  */
      /* positive residue and the lsd of dn is 0 or 5, in which case  */
      /* it is bumped; when residue is <0, the number is therefore  */
      /* bumped down unless the final digit was 1 or 6 (in which  */
      /* case it is bumped down and then up -- a no-op)  */
      Int lsd5=*dn->lsu%5;     /* get lsd and quintate  */
      if (residue<0 && lsd5!=1) bump=-1;
       else if (residue>0 && lsd5==0) bump=1;
      /* [bump==1 could be applied directly; use common path for clarity]  */
      break;} /* r-05  */

    case DEC_ROUND_DOWN: {
      /* no change, except if negative residue  */
      if (residue<0) bump=-1;
      break;} /* r-d  */

    case DEC_ROUND_HALF_DOWN: {
      if (residue>5) bump=1;
      break;} /* r-h-d  */

    case DEC_ROUND_HALF_EVEN: {
      if (residue>5) bump=1;            /* >0.5 goes up  */
       else if (residue==5) {           /* exactly 0.5000...  */
        /* 0.5 goes up iff [new] lsd is odd  */
        if (*dn->lsu & 0x01) bump=1;
        }
      break;} /* r-h-e  */

    case DEC_ROUND_HALF_UP: {
      if (residue>=5) bump=1;
      break;} /* r-h-u  */

    case DEC_ROUND_UP: {
      if (residue>0) bump=1;
      break;} /* r-u  */

    case DEC_ROUND_CEILING: {
      /* same as _UP for positive numbers, and as _DOWN for negatives  */
      /* [negative residue cannot occur on 0]  */
      if (decNumberIsNegative(dn)) {
        if (residue<0) bump=-1;
        }
       else {
        if (residue>0) bump=1;
        }
      break;} /* r-c  */

    case DEC_ROUND_FLOOR: {
      /* same as _UP for negative numbers, and as _DOWN for positive  */
      /* [negative residue cannot occur on 0]  */
      if (!decNumberIsNegative(dn)) {
        if (residue<0) bump=-1;
        }
       else {
        if (residue>0) bump=1;
        }
      break;} /* r-f  */

    default: {      /* e.g., DEC_ROUND_MAX  */
      *status|=DEC_Invalid_context;
      #if DECTRACE || (DECCHECK && DECVERB)
      printf("Unknown rounding mode: %d\n", set->round);
      #endif
      break;}
    } /* switch  */

  /* now bump the number, up or down, if need be  */
  if (bump==0) return;                       /* no action required  */

  /* Simply use decUnitAddSub unless bumping up and the number is  */
  /* all nines.  In this special case set to 100... explicitly  */
  /* and adjust the exponent by one (as otherwise could overflow  */
  /* the array)  */
  /* Similarly handle all-nines result if bumping down.  */
  if (bump>0) {
    Unit *up;                                /* work  */
    uInt count=dn->digits;                   /* digits to be checked  */
    for (up=dn->lsu; ; up++) {
      if (count<=DECDPUN) {
        /* this is the last Unit (the msu)  */
        if (*up!=powers[count]-1) break;     /* not still 9s  */
        /* here if it, too, is all nines  */
        *up=(Unit)powers[count-1];           /* here 999 -> 100 etc.  */
        for (up=up-1; up>=dn->lsu; up--) *up=0; /* others all to 0  */
        dn->exponent++;                      /* and bump exponent  */
        /* [which, very rarely, could cause Overflow...]  */
        if ((dn->exponent+dn->digits)>set->emax+1) {
          decSetOverflow(dn, set, status);
          }
        return;                              /* done  */
        }
      /* a full unit to check, with more to come  */
      if (*up!=DECDPUNMAX) break;            /* not still 9s  */
      count-=DECDPUN;
      } /* up  */
    } /* bump>0  */
   else {                                    /* -1  */
    /* here checking for a pre-bump of 1000... (leading 1, all  */
    /* other digits zero)  */
    Unit *up, *sup;                          /* work  */
    uInt count=dn->digits;                   /* digits to be checked  */
    for (up=dn->lsu; ; up++) {
      if (count<=DECDPUN) {
        /* this is the last Unit (the msu)  */
        if (*up!=powers[count-1]) break;     /* not 100..  */
        /* here if have the 1000... case  */
        sup=up;                              /* save msu pointer  */
        *up=(Unit)powers[count]-1;           /* here 100 in msu -> 999  */
        /* others all to all-nines, too  */
        for (up=up-1; up>=dn->lsu; up--) *up=(Unit)powers[DECDPUN]-1;
        dn->exponent--;                      /* and bump exponent  */

        /* iff the number was at the subnormal boundary (exponent=etiny)  */
        /* then the exponent is now out of range, so it will in fact get  */
        /* clamped to etiny and the final 9 dropped.  */
        /* printf(">> emin=%d exp=%d sdig=%d\n", set->emin,  */
        /*        dn->exponent, set->digits);  */
        if (dn->exponent+1==set->emin-set->digits+1) {
          if (count==1 && dn->digits==1) *sup=0;  /* here 9 -> 0[.9]  */
           else {
            *sup=(Unit)powers[count-1]-1;    /* here 999.. in msu -> 99..  */
            dn->digits--;
            }
          dn->exponent++;
          *status|=DEC_Underflow | DEC_Subnormal | DEC_Inexact | DEC_Rounded;
          }
        return;                              /* done  */
        }

      /* a full unit to check, with more to come  */
      if (*up!=0) break;                     /* not still 0s  */
      count-=DECDPUN;
      } /* up  */

    } /* bump<0  */

  /* Actual bump needed.  Do it.  */
  decUnitAddSub(dn->lsu, D2U(dn->digits), uarrone, 1, 0, dn->lsu, bump);
  }